

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeBoolConstant(Builder *this,bool b,bool specConstant)

{
  int iVar1;
  Id IVar2;
  Op OVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *this_00;
  undefined7 in_register_00000031;
  size_t size;
  int local_64;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_58 [3];
  Instruction *local_40;
  Instruction *c;
  Id local_30;
  int i;
  Id existing;
  Op opcode;
  Instruction *constant;
  Id typeId;
  bool specConstant_local;
  bool b_local;
  Builder *this_local;
  
  size = CONCAT71(in_register_00000031,b);
  constant._6_1_ = specConstant;
  constant._7_1_ = b;
  _typeId = this;
  constant._0_4_ = makeBoolType(this);
  if ((constant._6_1_ & 1) == 0) {
    local_64 = 0x2a;
    if ((constant._7_1_ & 1) != 0) {
      local_64 = 0x29;
    }
  }
  else {
    local_64 = 0x31;
    if ((constant._7_1_ & 1) != 0) {
      local_64 = 0x30;
    }
  }
  i = local_64;
  if ((constant._6_1_ & 1) == 0) {
    local_30 = 0;
    for (c._4_4_ = 0; iVar1 = c._4_4_,
        sVar4 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ::size(this->groupedConstants + 0x14), iVar1 < (int)sVar4; c._4_4_ = c._4_4_ + 1) {
      size = (size_t)c._4_4_;
      ppIVar5 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ::operator[](this->groupedConstants + 0x14,size);
      _existing = *ppIVar5;
      IVar2 = Instruction::getTypeId(_existing);
      if ((IVar2 == (Id)constant) && (OVar3 = Instruction::getOpCode(_existing), OVar3 == i)) {
        local_30 = Instruction::getResultId(_existing);
      }
    }
    if (local_30 != 0) {
      return local_30;
    }
  }
  this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
  IVar2 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar2,(Id)constant,i);
  local_40 = this_00;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_58,this_00)
  ;
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)local_58);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_58);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedConstants + 0x14,&local_40);
  Module::mapInstruction(&this->module,local_40);
  IVar2 = Instruction::getResultId(local_40);
  return IVar2;
}

Assistant:

Id Builder::makeBoolConstant(bool b, bool specConstant)
{
    Id typeId = makeBoolType();
    Instruction* constant;
    Op opcode = specConstant ? (b ? OpSpecConstantTrue : OpSpecConstantFalse) : (b ? OpConstantTrue : OpConstantFalse);

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = 0;
        for (int i = 0; i < (int)groupedConstants[OpTypeBool].size(); ++i) {
            constant = groupedConstants[OpTypeBool][i];
            if (constant->getTypeId() == typeId && constant->getOpCode() == opcode)
                existing = constant->getResultId();
        }

        if (existing)
            return existing;
    }

    // Make it
    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeBool].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}